

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readgamma.hpp
# Opt level: O0

vector<TensorEntry,_std::allocator<TensorEntry>_> *
readGamma(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,int n)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  reference pvVar4;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  TensorEntry entry;
  __cxx11 local_280 [32];
  string local_260 [32];
  istream local_240 [8];
  ifstream sparsefile;
  string local_38 [8];
  string line;
  int n_local;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *sparsegamma;
  
  std::vector<TensorEntry,_std::allocator<TensorEntry>_>::vector(__return_storage_ptr__);
  std::__cxx11::string::string(local_38);
  std::__cxx11::to_string(local_280,n);
  std::operator+((char *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "../gamma/sparse");
  std::ifstream::ifstream(local_240,local_260,_S_in);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string((string *)local_280);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_2d0,(ulong)local_38);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_2b0,local_2d0,',');
    std::__cxx11::string::~string((string *)local_2d0);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2b0,0);
    iVar2 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = (undefined2)iVar2;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2b0,1);
    iVar2 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = (undefined2)iVar2;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2b0,2);
    iVar2 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = (undefined2)iVar2;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2b0,3);
    std::__cxx11::stof(pvVar4,(size_t *)0x0);
    std::vector<TensorEntry,_std::allocator<TensorEntry>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               &tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b0);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<TensorEntry> readGamma(int n)
{
    std::vector<TensorEntry> sparsegamma;
    std::string line;
    std::ifstream sparsefile("../gamma/sparse" + std::to_string(n));
    TensorEntry entry;
    while(getline(sparsefile, line))
    {
        std::vector<std::string> tokens = split(line.substr(1, line.length() - 3), ',');
        entry.a = std::stoi(tokens[0]);
        entry.b = std::stoi(tokens[1]);
        entry.c = std::stoi(tokens[2]);
        entry.val = std::stof(tokens[3]);
        sparsegamma.push_back(entry);
    }
    sparsefile.close();
    return sparsegamma;
}